

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_struct_declaration
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool pointers,
          bool read,bool write,bool swap,bool is_user_struct)

{
  int *piVar1;
  pointer pptVar2;
  pointer pcVar3;
  t_field *ptVar4;
  string name;
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  byte bVar8;
  byte pointer;
  int iVar9;
  ostream *poVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  t_type *ptVar11;
  undefined4 extraout_var_11;
  t_const_value *ptVar12;
  long *plVar13;
  iterator iVar14;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  t_cpp_generator *ptVar15;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined7 in_register_00000009;
  char *pcVar16;
  pointer pptVar17;
  _Base_ptr *pp_Var18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  long lVar20;
  t_type *ptVar21;
  t_cpp_generator *this_00;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  t_struct *tstruct_00;
  bool bVar22;
  string args_indent;
  string dval;
  string extends;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  string in_stack_fffffffffffffe98;
  string sVar23;
  undefined7 in_stack_fffffffffffffe99;
  undefined7 uVar24;
  size_type in_stack_fffffffffffffea0;
  undefined1 local_158 [24];
  string local_140;
  byte local_11d;
  undefined4 local_11c;
  int local_118;
  undefined4 local_114;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Base_ptr *local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr p_Stack_98;
  t_type *local_90 [2];
  undefined1 local_80 [48];
  undefined1 local_50 [32];
  
  local_114 = (undefined4)CONCAT71(in_register_00000089,read);
  local_11c = (undefined4)CONCAT71(in_register_00000081,pointers);
  local_d0 = local_c8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0);
  local_118 = (int)CONCAT71(in_register_00000009,is_exception);
  if (local_118 == 0) {
    if ((is_user_struct) && (this->gen_templates_ == false)) {
      pcVar16 = " : public virtual ::apache::thrift::TBase";
      goto LAB_001811a8;
    }
  }
  else {
    pcVar16 = " : public ::apache::thrift::TException";
LAB_001811a8:
    std::__cxx11::string::_M_replace
              ((ulong)&local_d0,0,(char *)local_c8._M_allocated_capacity,(ulong)pcVar16);
  }
  pptVar17 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  pptVar2 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar17 == pptVar2) {
    local_11d = 0;
  }
  else {
    local_11d = 0;
    do {
      if ((*pptVar17)->req_ != T_REQUIRED) {
        local_11d = 1;
      }
      pptVar17 = pptVar17 + 1;
    } while (pptVar17 != pptVar2);
  }
  local_11d = ((byte)local_11c ^ 1 | (byte)local_114) & local_11d;
  local_158._16_8_ = tstruct;
  if (local_11d == 1) {
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(char *)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98),
                         in_stack_fffffffffffffea0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"typedef struct _",0x10);
    iVar9 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"__isset {",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98) != local_158) {
      operator_delete((undefined1 *)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98));
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar10 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"_",1);
    iVar9 = (*(((t_type *)local_158._16_8_)->super_t_doc)._vptr_t_doc[3])();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_00,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_00,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"__isset() ",10);
    pptVar17 = (((members_type *)(local_158._16_8_ + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (pptVar17 !=
        (((members_type *)(local_158._16_8_ + 0x88))->
        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      bVar6 = true;
      do {
        if ((*pptVar17)->req_ != T_REQUIRED) {
          bVar22 = (*pptVar17)->value_ == (t_const_value *)0x0;
          pcVar16 = "true";
          if (bVar22) {
            pcVar16 = "false";
          }
          in_stack_fffffffffffffe98 = SUB81(local_158,0);
          in_stack_fffffffffffffe99 = (undefined7)((ulong)local_158 >> 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffe98,pcVar16,pcVar16 + (ulong)bVar22 + 4);
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>(out,": ",2);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (out,((*pptVar17)->name_)._M_dataplus._M_p,
                                 ((*pptVar17)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)CONCAT71(in_stack_fffffffffffffe99,
                                                          in_stack_fffffffffffffe98),
                                 in_stack_fffffffffffffea0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
            bVar6 = false;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (out,((*pptVar17)->name_)._M_dataplus._M_p,
                                 ((*pptVar17)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)CONCAT71(in_stack_fffffffffffffe99,
                                                          in_stack_fffffffffffffe98),
                                 in_stack_fffffffffffffea0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          }
          if ((undefined1 *)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98) !=
              local_158) {
            operator_delete((undefined1 *)
                            CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98));
          }
        }
        pptVar17 = pptVar17 + 1;
      } while (pptVar17 !=
               (((members_type *)(local_158._16_8_ + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," {}",3);
    uVar5 = local_158._16_8_;
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar17 = (((members_type *)(uVar5 + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (pptVar17 !=
        (((members_type *)(uVar5 + 0x88))->super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if ((*pptVar17)->req_ != T_REQUIRED) {
          poVar10 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"bool ",5);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," :1;",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        pptVar17 = pptVar17 + 1;
      } while (pptVar17 !=
               (((members_type *)(local_158._16_8_ + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar10 = t_generator::indent((t_generator *)this,out);
    uVar5 = local_158._16_8_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"} _",3);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_01,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_01,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"__isset;",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])
            (this,out,local_158._16_8_);
  t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (out,(char *)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffea0);
  tstruct_00 = (t_struct *)local_158._16_8_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"class ",6);
  iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,*(char **)CONCAT44(extraout_var_02,iVar9),
                       ((undefined8 *)CONCAT44(extraout_var_02,iVar9))[1]);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_d0,local_c8._M_allocated_capacity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," {",2);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," public:",8);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  ptVar15 = (t_cpp_generator *)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98);
  if (ptVar15 != (t_cpp_generator *)local_158) {
    operator_delete(ptVar15);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if ((char)local_11c == '\0') {
    bVar6 = is_struct_storage_not_throwing(ptVar15,tstruct_00);
    poVar10 = t_generator::indent((t_generator *)this,out);
    iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_03,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_03,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(const ",7);
    iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_04,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_04,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"&)",2);
    pcVar16 = "";
    if (bVar6) {
      pcVar16 = " noexcept";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar16,(ulong)bVar6 * 9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,&stack0xfffffffffffffe98,1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (this->gen_moveable_ == true) {
      poVar10 = t_generator::indent((t_generator *)this,out);
      iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,*(char **)CONCAT44(extraout_var_05,iVar9),
                           ((undefined8 *)CONCAT44(extraout_var_05,iVar9))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
      iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,*(char **)CONCAT44(extraout_var_06,iVar9),
                           ((undefined8 *)CONCAT44(extraout_var_06,iVar9))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"&&) noexcept;",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    poVar10 = t_generator::indent((t_generator *)this,out);
    iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_07,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_07,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"& operator=(const ",0x12);
    iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_08,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_08,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"&)",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar16,(ulong)bVar6 * 9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,&stack0xfffffffffffffe98,1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (this->gen_moveable_ == true) {
      poVar10 = t_generator::indent((t_generator *)this,out);
      iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,*(char **)CONCAT44(extraout_var_09,iVar9),
                           ((undefined8 *)CONCAT44(extraout_var_09,iVar9))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"& operator=(",0xc);
      iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,*(char **)CONCAT44(extraout_var_10,iVar9),
                           ((undefined8 *)CONCAT44(extraout_var_10,iVar9))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"&&) noexcept;",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    pptVar17 = (((members_type *)((long)tstruct_00 + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (pptVar17 ==
        (((members_type *)((long)tstruct_00 + 0x88))->
        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      cVar7 = '\0';
      bVar6 = false;
    }
    else {
      cVar7 = '\0';
      bVar6 = false;
      do {
        ptVar11 = t_type::get_true_type((*pptVar17)->type_);
        if ((*pptVar17)->reference_ == false) {
          iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[6])(ptVar11);
          bVar22 = true;
          if ((char)iVar9 != '\0') goto LAB_00181a0b;
        }
        else {
LAB_00181a0b:
          bVar22 = (*pptVar17)->value_ == (t_const_value *)0x0;
          if (!bVar22) {
            cVar7 = '\x01';
            bVar6 = true;
          }
        }
      } while ((bVar22) &&
              (pptVar17 = pptVar17 + 1,
              pptVar17 !=
              (((members_type *)((long)tstruct_00 + 0x88))->
              super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
              super__Vector_impl_data._M_finish));
    }
    iVar9 = (*(tstruct_00->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct_00);
    sVar23 = SUB81(local_158,0);
    uVar24 = (undefined7)((ulong)local_158 >> 8);
    lVar20 = *(long *)CONCAT44(extraout_var_11,iVar9);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xfffffffffffffe98,lVar20,
               ((long *)CONCAT44(extraout_var_11,iVar9))[1] + lVar20);
    std::__cxx11::string::append(&stack0xfffffffffffffe98);
    poVar10 = t_generator::indent((t_generator *)this,out);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    pcVar16 = " noexcept";
    if (bVar6) {
      pcVar16 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar16,(ulong)(byte)~bVar6 * 9);
    t_generator::indent_abi_cxx11_((string *)local_110,(t_generator *)this);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_140,
               (cVar7 - 1U | 3) + (char)local_110._8_8_ + (char)in_stack_fffffffffffffea0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._0_8_ != &local_100) {
      operator_delete((void *)local_110._0_8_);
    }
    pptVar17 = (((members_type *)((long)tstruct_00 + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (pptVar17 !=
        (((members_type *)((long)tstruct_00 + 0x88))->
        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      bVar22 = false;
      do {
        ptVar12 = (t_const_value *)t_type::get_true_type((*pptVar17)->type_);
        cVar7 = (**(code **)(*(long *)&(ptVar12->mapVal_)._M_t._M_impl + 0x28))(ptVar12);
        if (((cVar7 != '\0') ||
            (cVar7 = (**(code **)(*(long *)&(ptVar12->mapVal_)._M_t._M_impl + 0x50))(ptVar12),
            cVar7 != '\0')) || ((*pptVar17)->reference_ == true)) {
          local_110._0_8_ = &local_100;
          local_110._8_8_ = 0;
          local_100._M_local_buf[0] = '\0';
          if ((*pptVar17)->value_ == (t_const_value *)0x0) {
            cVar7 = (**(code **)(*(long *)&(ptVar12->mapVal_)._M_t._M_impl + 0x50))(ptVar12);
            if (cVar7 != '\0') {
              type_name_abi_cxx11_((string *)local_50,this,(t_type *)ptVar12,false,false);
              plVar13 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_50,0,(char *)0x0,0x382c93);
              local_b0 = &local_a0;
              pp_Var18 = (_Base_ptr *)(plVar13 + 2);
              if ((_Base_ptr *)*plVar13 == pp_Var18) {
                local_a0 = *pp_Var18;
                p_Stack_98 = (_Base_ptr)plVar13[3];
              }
              else {
                local_a0 = *pp_Var18;
                local_b0 = (_Base_ptr *)*plVar13;
              }
              local_a8 = (_Base_ptr)plVar13[1];
              *plVar13 = (long)pp_Var18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_b0);
              local_f0._0_8_ = &local_e0;
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 == paVar19) {
                local_e0._M_allocated_capacity = paVar19->_M_allocated_capacity;
                local_e0._8_8_ = plVar13[3];
              }
              else {
                local_e0._M_allocated_capacity = paVar19->_M_allocated_capacity;
                local_f0._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar13;
              }
              local_f0._8_8_ = plVar13[1];
              *plVar13 = (long)paVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              std::__cxx11::string::_M_append(local_110,local_f0._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._0_8_ != &local_e0) {
                operator_delete((void *)local_f0._0_8_);
              }
              if (local_b0 != &local_a0) {
                operator_delete(local_b0);
              }
              ptVar11 = (t_type *)(local_50 + 0x10);
              ptVar21 = (t_type *)local_50._0_8_;
              goto LAB_00181dbd;
            }
            (**(code **)(*(long *)&(ptVar12->mapVal_)._M_t._M_impl + 0x30))(ptVar12);
            std::__cxx11::string::append(local_110);
          }
          else {
            ptVar11 = (t_type *)local_80;
            pcVar3 = ((*pptVar17)->name_)._M_dataplus._M_p;
            local_90[0] = ptVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar3,pcVar3 + ((*pptVar17)->name_)._M_string_length);
            name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe8c;
            name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe88;
            name._M_string_length = (size_type)this;
            name.field_2._M_local_buf[0] = (char)sVar23;
            name.field_2._M_allocated_capacity._1_7_ = uVar24;
            name.field_2._8_8_ = in_stack_fffffffffffffea0;
            render_const_value((string *)local_f0,this,out,name,ptVar11,ptVar12);
            std::__cxx11::string::_M_append(local_110,local_f0._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._0_8_ != &local_e0) {
              operator_delete((void *)local_f0._0_8_);
            }
            ptVar11 = (t_type *)local_80;
            ptVar21 = local_90[0];
LAB_00181dbd:
            if (ptVar21 != ptVar11) {
              operator_delete(ptVar21);
            }
          }
          if (bVar22) {
            std::__ostream_insert<char,std::char_traits<char>>(out,",\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,local_140._M_dataplus._M_p,local_140._M_string_length);
          }
          else if (bVar6) {
            bVar22 = true;
            std::__ostream_insert<char,std::char_traits<char>>(out," : ",3);
          }
          else {
            local_f0[0] = 10;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>(out,local_f0,1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
            bVar22 = true;
            std::__cxx11::string::append((char *)&local_140);
          }
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (out,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)local_110._0_8_,local_110._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._0_8_ != &local_100) {
            operator_delete((void *)local_110._0_8_);
          }
        }
        pptVar17 = pptVar17 + 1;
      } while (pptVar17 !=
               (((members_type *)(local_158._16_8_ + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," {",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar17 = (((members_type *)(local_158._16_8_ + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (pptVar17 !=
        (((members_type *)(local_158._16_8_ + 0x88))->
        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        ptVar11 = t_type::get_true_type((*pptVar17)->type_);
        iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[5])(ptVar11);
        if ((char)iVar9 == '\0') {
          ptVar4 = *pptVar17;
          ptVar12 = ptVar4->value_;
          if (ptVar12 != (t_const_value *)0x0) {
            pcVar3 = (ptVar4->name_)._M_dataplus._M_p;
            local_80._16_8_ = local_80 + 0x20;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_80 + 0x10),pcVar3,pcVar3 + (ptVar4->name_)._M_string_length)
            ;
            print_const_value(this,out,(string *)(local_80 + 0x10),ptVar11,ptVar12);
            if ((undefined1 *)local_80._16_8_ != local_80 + 0x20) {
              operator_delete((void *)local_80._16_8_);
            }
          }
        }
        pptVar17 = pptVar17 + 1;
      } while (pptVar17 !=
               (((members_type *)(local_158._16_8_ + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    tstruct_00 = (t_struct *)local_158._16_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
  }
  sVar23 = SUB81(local_158,0);
  uVar24 = (undefined7)((ulong)local_158 >> 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe98,"final","");
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&(tstruct_00->super_t_type).annotations_._M_t,(key_type *)&stack0xfffffffffffffe98
                 );
  if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
    operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
  }
  if ((_Rb_tree_header *)iVar14._M_node ==
      &(tstruct_00->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    uVar5 = local_158._16_8_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"virtual ~",9);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_12,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_12,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"() noexcept;",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
  }
  pptVar17 = (((members_type *)(local_158._16_8_ + 0x88))->
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar17 !=
      (((members_type *)(local_158._16_8_ + 0x88))->
      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar8 = (byte)local_114;
    do {
      ptVar15 = this;
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x21])(this,out,*pptVar17)
      ;
      poVar10 = t_generator::indent((t_generator *)this,out);
      ptVar4 = *pptVar17;
      if ((char)local_11c == '\0') {
        pointer = false;
        this = ptVar15;
      }
      else {
        iVar9 = (*(ptVar4->type_->super_t_doc)._vptr_t_doc[0xc])();
        pointer = (byte)iVar9 ^ 1;
        this = ptVar15;
      }
      declare_field_abi_cxx11_
                ((string *)&stack0xfffffffffffffe98,this,ptVar4,false,(bool)pointer,
                 (bool)(bVar8 ^ 1),false);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
      pptVar17 = pptVar17 + 1;
    } while (pptVar17 !=
             (((members_type *)(local_158._16_8_ + 0x88))->
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_11d != 0) {
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    uVar5 = local_158._16_8_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"_",1);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_13,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_13,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"__isset __isset;",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
  }
  pptVar17 = (((members_type *)(local_158._16_8_ + 0x88))->
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar17 !=
      (((members_type *)(local_158._16_8_ + 0x88))->
      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      if ((char)local_11c == '\0') {
        if ((*pptVar17)->reference_ == true) {
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (out,::endl_abi_cxx11_._M_dataplus._M_p,
                               ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void __set_",0xb);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(::std::shared_ptr<",0x13);
          type_name_abi_cxx11_(&local_140,this,(*pptVar17)->type_,false,false);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,">",1);
        }
        else {
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (out,::endl_abi_cxx11_._M_dataplus._M_p,
                               ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void __set_",0xb);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
          type_name_abi_cxx11_(&local_140,this,(*pptVar17)->type_,false,true);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
          operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," val);",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      pptVar17 = pptVar17 + 1;
    } while (pptVar17 !=
             (((members_type *)(local_158._16_8_ + 0x88))->
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (((char)local_11c == '\0') && (this->gen_no_default_operators_ == false)) {
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    uVar5 = local_158._16_8_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"bool operator == (const ",0x18);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_14,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_14,iVar9))[1]);
    lVar20 = 3;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," & ",3);
    pcVar16 = "rhs";
    if ((((members_type *)(uVar5 + 0x88))->super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (((members_type *)(uVar5 + 0x88))->super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      pcVar16 = "/* rhs */";
      lVar20 = 9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar16,lVar20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") const",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    ptVar15 = this;
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      ptVar15 = this;
    }
    t_oop_generator::scope_up(&ptVar15->super_t_oop_generator,out);
    uVar5 = local_158._16_8_;
    pptVar17 = (((members_type *)(local_158._16_8_ + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (pptVar17 !=
        (((members_type *)(local_158._16_8_ + 0x88))->
        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        if ((*pptVar17)->req_ == T_OPTIONAL) {
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)ptVar15);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"if (__isset.",0xc);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," != rhs.__isset.",0x10);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                               ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_140,(t_generator *)ptVar15);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  return false;",0xf);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                               ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)local_110,(t_generator *)ptVar15);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)local_110._0_8_,local_110._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"else if (__isset.",0x11);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," && !(",6);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," == rhs.",8);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"))",2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                               ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)local_f0,(t_generator *)ptVar15);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)local_f0._0_8_,local_f0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  return false;",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._0_8_ != &local_e0) {
            operator_delete((void *)local_f0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._0_8_ != &local_100) {
            operator_delete((void *)local_110._0_8_);
          }
        }
        else {
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)ptVar15);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"if (!(",6);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," == rhs.",8);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((*pptVar17)->name_)._M_dataplus._M_p,
                               ((*pptVar17)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"))",2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                               ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_140,(t_generator *)ptVar15);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  return false;",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
          operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
        }
        pptVar17 = pptVar17 + 1;
      } while (pptVar17 !=
               (((members_type *)(uVar5 + 0x88))->
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    poVar10 = t_generator::indent((t_generator *)ptVar15,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"return true;",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_down(&ptVar15->super_t_oop_generator,out);
    this = ptVar15;
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)ptVar15);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    uVar5 = local_158._16_8_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"bool operator != (const ",0x18);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_15,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_15,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," &rhs) const {",0xe);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)ptVar15);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  return !(*this == rhs);",0x19);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_((string *)local_110,(t_generator *)ptVar15);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_110._0_8_,local_110._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._0_8_ != &local_100) {
      operator_delete((void *)local_110._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)ptVar15);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"bool operator < (const ",0x17);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_16,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_16,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," & ) const;",0xb);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
  }
  if ((byte)local_114 != '\0') {
    if (this->gen_templates_ == true) {
      ptVar15 = this;
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"template <class Protocol_>",0x1a);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"uint32_t read(Protocol_* iprot);",0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      this = ptVar15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
        this = ptVar15;
      }
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
    }
    else {
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"uint32_t read(",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"::apache::thrift::protocol::TProtocol* iprot)",0x2d);
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
      if (((char)local_118 == '\0') && ((char *)local_c8._M_allocated_capacity != (char *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>(out," override",9);
      }
      sVar23 = (string)0x3b;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(out,&stack0xfffffffffffffe98,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  if (write) {
    if (this->gen_templates_ == true) {
      ptVar15 = this;
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"template <class Protocol_>",0x1a);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"uint32_t write(Protocol_* oprot) const;",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      this = ptVar15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
        this = ptVar15;
      }
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
    }
    else {
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"uint32_t write(",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"::apache::thrift::protocol::TProtocol* oprot) const",0x33);
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
      if (((char)local_118 == '\0') && ((char *)local_c8._M_allocated_capacity != (char *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>(out," override",9);
      }
      sVar23 = (string)0x3b;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(out,&stack0xfffffffffffffe98,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((is_user_struct) && (bVar6 = has_custom_ostream(this,(t_type *)local_158._16_8_), !bVar6)) {
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"virtual ",8);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"void ",5);
    std::__ostream_insert<char,std::char_traits<char>>(out,"printTo(std::ostream& out) const",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(out,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((char)local_118 != '\0') {
    ptVar15 = this;
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    uVar5 = local_158._16_8_;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"mutable std::string thriftTExceptionMessageHolder_;",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_158) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    this_00 = (t_cpp_generator *)CONCAT71(uVar24,sVar23);
    this = ptVar15;
    if (this_00 != (t_cpp_generator *)local_158) {
      operator_delete(this_00);
      this = ptVar15;
    }
    generate_exception_what_method_decl(this_00,out,(t_struct *)uVar5,false);
    std::__ostream_insert<char,std::char_traits<char>>(out,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar10 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"};",2);
  ptVar15 = (t_cpp_generator *)
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ptVar15,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  if (!swap) goto LAB_00183307;
  iVar9 = (*(((t_type *)local_158._16_8_)->super_t_doc)._vptr_t_doc[3])();
  iVar9 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_17,iVar9));
  if (iVar9 == 0) {
LAB_0018322c:
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    uVar5 = local_158._16_8_;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void swap(",10);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_21,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_21,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," &a1, ",6);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_22,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_22,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," &a2);",6);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    iVar9 = (*(((t_type *)local_158._16_8_)->super_t_doc)._vptr_t_doc[3])();
    iVar9 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_18,iVar9));
    if (iVar9 == 0) goto LAB_0018322c;
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe98,(t_generator *)this);
    uVar5 = local_158._16_8_;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(char *)CONCAT71(uVar24,sVar23),in_stack_fffffffffffffea0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void swap(",10);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_19,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_19,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," &a, ",5);
    iVar9 = (*(((t_type *)uVar5)->super_t_doc)._vptr_t_doc[3])(uVar5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,*(char **)CONCAT44(extraout_var_20,iVar9),
                         ((undefined8 *)CONCAT44(extraout_var_20,iVar9))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," &b);",5);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  ptVar15 = (t_cpp_generator *)CONCAT71(uVar24,sVar23);
  if (ptVar15 != (t_cpp_generator *)local_158) {
    operator_delete(ptVar15);
  }
LAB_00183307:
  if (is_user_struct) {
    generate_struct_ostream_operator_decl(ptVar15,out,(t_struct *)local_158._16_8_);
  }
  if (local_d0 != local_c8._M_local_buf + 8) {
    operator_delete(local_d0);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_struct_declaration(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception,
                                                  bool pointers,
                                                  bool read,
                                                  bool write,
                                                  bool swap,
                                                  bool is_user_struct) {
  string extends = "";
  if (is_exception) {
    extends = " : public ::apache::thrift::TException";
  } else {
    if (is_user_struct && !gen_templates_) {
      extends = " : public virtual ::apache::thrift::TBase";
    }
  }

  // Get members
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  // Write the isset structure declaration outside the class. This makes
  // the generated code amenable to processing by SWIG.
  // We only declare the struct if it gets used in the class.

  // Isset struct has boolean fields, but only for non-required fields.
  bool has_nonrequired_fields = false;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if ((*m_iter)->get_req() != t_field::T_REQUIRED)
      has_nonrequired_fields = true;
  }

  if (has_nonrequired_fields && (!pointers || read)) {

    out << indent() << "typedef struct _" << tstruct->get_name() << "__isset {" << endl;
    indent_up();

    indent(out) << "_" << tstruct->get_name() << "__isset() ";
    bool first = true;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() == t_field::T_REQUIRED) {
        continue;
      }
      string isSet = ((*m_iter)->get_value() != nullptr) ? "true" : "false";
      if (first) {
        first = false;
        out << ": " << (*m_iter)->get_name() << "(" << isSet << ")";
      } else {
        out << ", " << (*m_iter)->get_name() << "(" << isSet << ")";
      }
    }
    out << " {}" << endl;

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_REQUIRED) {
        indent(out) << "bool " << (*m_iter)->get_name() << " :1;" << endl;
      }
    }

    indent_down();
    indent(out) << "} _" << tstruct->get_name() << "__isset;" << endl;
  }

  out << endl;

  generate_java_doc(out, tstruct);

  // Open struct def
  out << indent() << "class " << tstruct->get_name() << extends << " {" << endl << indent()
      << " public:" << endl << endl;
  indent_up();

  if (!pointers) {
    bool ok_noexcept = is_struct_storage_not_throwing(tstruct);
    // Copy constructor
    indent(out) << tstruct->get_name() << "(const " << tstruct->get_name() << "&)"
                << (ok_noexcept? " noexcept" : "") << ';' << endl;

    // Move constructor
    if (gen_moveable_) {
      indent(out) << tstruct->get_name() << "(" << tstruct->get_name() << "&&) noexcept;" 
                  << endl;
    }

    // Assignment Operator
    indent(out) << tstruct->get_name() << "& operator=(const " << tstruct->get_name() << "&)"
                << (ok_noexcept? " noexcept" : "") << ';' << endl;

    // Move assignment operator
    if (gen_moveable_) {
      indent(out) << tstruct->get_name() << "& operator=(" << tstruct->get_name() << "&&) noexcept;" 
                  << endl;
    }

    bool has_default_value = false;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if (is_reference(*m_iter) || t->is_string()) {
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          has_default_value = true;
          break;
        }
      }
    }

    // Default constructor
    std::string clsname_ctor = tstruct->get_name() + "()";
    indent(out) << clsname_ctor << (has_default_value ? "" : " noexcept");

    bool init_ctor = false;
    std::string args_indent(
      indent().size() + clsname_ctor.size() + (has_default_value ? 3 : -1), ' ');

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if (t->is_base_type() || t->is_enum() || is_reference(*m_iter)) {
        string dval;
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          dval += render_const_value(out, (*m_iter)->get_name(), t, cv);
        } else if (t->is_enum()) {
          dval += "static_cast<" + type_name(t) + ">(0)";
        } else {
          dval += (t->is_string() || is_reference(*m_iter)) ? "" : "0";
        }
        if (!init_ctor) {
          init_ctor = true;
          if(has_default_value) {
            out << " : ";
          } else {
            out << '\n' << args_indent << ": ";
            args_indent.append("  ");
          }
        } else {
          out << ",\n" << args_indent;
        }
        out << (*m_iter)->get_name() << "(" << dval << ")";
      }
    }
    out << " {" << endl;
    indent_up();
    // TODO(dreiss): When everything else in Thrift is perfect,
    // do more of these in the initializer list.
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());

      if (!t->is_base_type()) {
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          print_const_value(out, (*m_iter)->get_name(), t, cv);
        }
      }
    }
    scope_down(out);
  }

  if (tstruct->annotations_.find("final") == tstruct->annotations_.end()) {
    out << endl << indent() << "virtual ~" << tstruct->get_name() << "() noexcept;" << endl;
  }

  // Declare all fields
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
	generate_java_doc(out, *m_iter);
    indent(out) << declare_field(*m_iter,
                                 false,
                                 (pointers && !(*m_iter)->get_type()->is_xception()),
                                 !read) << endl;
  }

  // Add the __isset data member if we need it, using the definition from above
  if (has_nonrequired_fields && (!pointers || read)) {
    out << endl << indent() << "_" << tstruct->get_name() << "__isset __isset;" << endl;
  }

  // Create a setter function for each field
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (pointers) {
      continue;
    }
    if (is_reference((*m_iter))) {
      out << endl << indent() << "void __set_" << (*m_iter)->get_name() << "(::std::shared_ptr<"
          << type_name((*m_iter)->get_type(), false, false) << ">";
      out << " val);" << endl;
    } else {
      out << endl << indent() << "void __set_" << (*m_iter)->get_name() << "("
          << type_name((*m_iter)->get_type(), false, true);
      out << " val);" << endl;
    }
  }
  out << endl;

  if (!pointers) {
    // Should we generate default operators?
    if (!gen_no_default_operators_) {
      // Generate an equality testing operator.  Make it inline since the compiler
      // will do a better job than we would when deciding whether to inline it.
      out << indent() << "bool operator == (const " << tstruct->get_name() << " & "
          << (members.size() > 0 ? "rhs" : "/* rhs */") << ") const" << endl;
      scope_up(out);
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        // Most existing Thrift code does not use isset or optional/required,
        // so we treat "default" fields as required.
        if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
          out << indent() << "if (!(" << (*m_iter)->get_name() << " == rhs."
              << (*m_iter)->get_name() << "))" << endl << indent() << "  return false;" << endl;
        } else {
          out << indent() << "if (__isset." << (*m_iter)->get_name() << " != rhs.__isset."
              << (*m_iter)->get_name() << ")" << endl << indent() << "  return false;" << endl
              << indent() << "else if (__isset." << (*m_iter)->get_name() << " && !("
              << (*m_iter)->get_name() << " == rhs." << (*m_iter)->get_name() << "))" << endl
              << indent() << "  return false;" << endl;
        }
      }
      indent(out) << "return true;" << endl;
      scope_down(out);
      out << indent() << "bool operator != (const " << tstruct->get_name() << " &rhs) const {"
          << endl << indent() << "  return !(*this == rhs);" << endl << indent() << "}" << endl
          << endl;

      // Generate the declaration of a less-than operator.  This must be
      // implemented by the application developer if they wish to use it.  (They
      // will get a link error if they try to use it without an implementation.)
      out << indent() << "bool operator < (const " << tstruct->get_name() << " & ) const;" << endl
          << endl;
    }
  }

  if (read) {
    if (gen_templates_) {
      out << indent() << "template <class Protocol_>" << endl << indent()
          << "uint32_t read(Protocol_* iprot);" << endl;
    } else {
      out << indent() << "uint32_t read("
          << "::apache::thrift::protocol::TProtocol* iprot)";
      if(!is_exception && !extends.empty())
        out << " override";
      out << ';' << endl;
    }
  }
  if (write) {
    if (gen_templates_) {
      out << indent() << "template <class Protocol_>" << endl << indent()
          << "uint32_t write(Protocol_* oprot) const;" << endl;
    } else {
      out << indent() << "uint32_t write("
          << "::apache::thrift::protocol::TProtocol* oprot) const";
      if(!is_exception && !extends.empty())
        out << " override";
      out << ';' << endl;
    }
  }
  out << endl;

  if (is_user_struct && !has_custom_ostream(tstruct)) {
    out << indent() << "virtual ";
    generate_struct_print_method_decl(out, nullptr);
    out << ";" << endl;
  }

  // std::exception::what()
  if (is_exception) {
    out << indent() << "mutable std::string thriftTExceptionMessageHolder_;" << endl;
    out << indent();
    generate_exception_what_method_decl(out, tstruct, false);
    out << ";" << endl;
  }

  indent_down();
  indent(out) << "};" << endl << endl;

  if (swap) {
    // Generate a namespace-scope swap() function
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "void swap(" << tstruct->get_name() << " &a1, " << tstruct->get_name()
          << " &a2);" << endl << endl;
    } else {
       out << indent() << "void swap(" << tstruct->get_name() << " &a, " << tstruct->get_name()
           << " &b);" << endl << endl;
    }
  }

  if (is_user_struct) {
    generate_struct_ostream_operator_decl(out, tstruct);
  }
}